

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

void secp256k1_ge_table_set_globalz(size_t len,secp256k1_ge *a,secp256k1_fe *zr)

{
  uint64_t *puVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  int iVar4;
  ulong uVar5;
  secp256k1_fe *a_00;
  uint uVar6;
  ulong uVar7;
  ulong extraout_RDX;
  secp256k1_ge *a_01;
  secp256k1_ge *a_02;
  secp256k1_ge *psVar8;
  secp256k1_fe *psVar9;
  uint64_t uVar10;
  ulong uVar11;
  secp256k1_gej *psVar12;
  secp256k1_gej *a_03;
  ulong uVar13;
  secp256k1_gej *r;
  secp256k1_gej *a_04;
  ulong uVar14;
  secp256k1_ge *a_05;
  secp256k1_gej *r_00;
  secp256k1_fe *psVar15;
  secp256k1_gej *psVar16;
  size_t sVar17;
  secp256k1_fe *b;
  secp256k1_gej *a_06;
  secp256k1_fe zs;
  secp256k1_fe zi2;
  secp256k1_fe sStack_420;
  secp256k1_fe sStack_3f0;
  secp256k1_gej *psStack_3c0;
  secp256k1_gej *psStack_3b8;
  secp256k1_gej *psStack_3b0;
  secp256k1_gej *psStack_3a8;
  secp256k1_gej *psStack_3a0;
  ulong uStack_398;
  secp256k1_gej *psStack_390;
  secp256k1_gej *psStack_388;
  secp256k1_gej *psStack_380;
  uint64_t uStack_378;
  uint64_t uStack_370;
  secp256k1_gej *psStack_368;
  secp256k1_gej *psStack_360;
  secp256k1_fe *psStack_358;
  secp256k1_gej *psStack_350;
  undefined1 auStack_348 [56];
  uint64_t uStack_310;
  uint64_t uStack_308;
  uint64_t uStack_300;
  uint64_t uStack_2f8;
  int iStack_2f0;
  undefined1 auStack_2e8 [56];
  uint64_t uStack_2b0;
  secp256k1_gej *psStack_2a8;
  secp256k1_gej *psStack_2a0;
  secp256k1_gej *psStack_298;
  ulong uStack_290;
  undefined1 auStack_288 [56];
  secp256k1_gej *psStack_250;
  uint64_t uStack_248;
  secp256k1_gej *psStack_240;
  ulong uStack_238;
  ulong uStack_230;
  secp256k1_fe sStack_228;
  secp256k1_fe sStack_1f8;
  secp256k1_fe sStack_1c8;
  secp256k1_fe sStack_198;
  undefined1 auStack_168 [96];
  secp256k1_fe *psStack_108;
  secp256k1_ge *psStack_f8;
  secp256k1_gej *psStack_f0;
  secp256k1_ge *local_e0;
  size_t local_d8;
  secp256k1_fe *local_d0;
  secp256k1_gej local_c8;
  
  psVar15 = zr;
  local_e0 = a;
  local_d8 = len;
  if (len != 0) {
    do {
      psStack_f0 = (secp256k1_gej *)0x11a24f;
      secp256k1_ge_verify(a);
      psStack_f0 = (secp256k1_gej *)0x11a257;
      secp256k1_fe_verify(psVar15);
      sVar17 = local_d8;
      psVar8 = local_e0;
      a = a + 1;
      len = len - 1;
      psVar15 = psVar15 + 1;
    } while (len != 0);
    psVar15 = (secp256k1_fe *)(local_d8 - 1);
    psVar9 = &local_e0[(long)psVar15].y;
    psStack_f0 = (secp256k1_gej *)0x11a286;
    secp256k1_fe_verify(psVar9);
    uVar5 = psVar8[(long)psVar15].y.n[4];
    a_00 = (secp256k1_fe *)(uVar5 & 0xffffffffffff);
    uVar7 = (uVar5 >> 0x30) * 0x1000003d1 + psVar9->n[0];
    uVar5 = (uVar7 >> 0x34) + psVar8[(long)psVar15].y.n[1];
    uVar11 = (uVar5 >> 0x34) + psVar8[(long)psVar15].y.n[2];
    uVar13 = (uVar11 >> 0x34) + psVar8[(long)psVar15].y.n[3];
    psVar12 = (secp256k1_gej *)(uVar11 & 0xfffffffffffff);
    psVar9->n[0] = uVar7 & 0xfffffffffffff;
    psVar8[(long)psVar15].y.n[1] = uVar5 & 0xfffffffffffff;
    psVar8[(long)psVar15].y.n[2] = (uint64_t)psVar12;
    psVar8[(long)psVar15].y.n[3] = uVar13 & 0xfffffffffffff;
    psVar8[(long)psVar15].y.n[4] = (long)a_00->n + (uVar13 >> 0x34);
    psVar8[(long)psVar15].y.magnitude = 1;
    psStack_f0 = (secp256k1_gej *)0x11a31b;
    secp256k1_fe_verify(psVar9);
    local_c8.x.n[0] = zr[(long)psVar15].n[0];
    local_c8.x.n[1] = zr[(long)psVar15].n[1];
    local_c8.x.n[2] = zr[(long)psVar15].n[2];
    local_c8.x.n[3] = (zr[(long)psVar15].n + 2)[1];
    local_c8.x.n[4] = zr[(long)psVar15].n[4];
    local_c8.x._40_8_ = (zr[(long)psVar15].n + 4)[1];
    local_d0 = psVar15;
    if (psVar15 != (secp256k1_fe *)0x0) {
      a_05 = psVar8 + (sVar17 - 2);
      b = zr + sVar17;
      psVar9 = (secp256k1_fe *)0x0;
      do {
        b = b + -1;
        if (psVar9 != (secp256k1_fe *)0x0) {
          psStack_f0 = (secp256k1_gej *)0x11a390;
          psVar12 = &local_c8;
          secp256k1_fe_mul(&local_c8.x,&local_c8.x,b);
        }
        psStack_f0 = (secp256k1_gej *)0x11a398;
        secp256k1_ge_verify(a_05);
        psStack_f0 = (secp256k1_gej *)0x11a3a0;
        r = &local_c8;
        secp256k1_fe_verify(&local_c8.x);
        if (a_05->infinity != 0) {
          psStack_f0 = (secp256k1_gej *)secp256k1_ecmult_table_get_ge_storage;
          secp256k1_ge_table_set_globalz_cold_1();
          psStack_f8 = psVar8;
          psStack_f0 = &local_c8;
          if ((extraout_RDX & 1) == 0) {
            psStack_108 = (secp256k1_fe *)0x11a50b;
            secp256k1_ecmult_table_get_ge_storage_cold_3();
LAB_0011a50b:
            psStack_108 = (secp256k1_fe *)0x11a510;
            secp256k1_ecmult_table_get_ge_storage_cold_2();
          }
          else {
            uVar6 = (uint)extraout_RDX;
            if ((int)uVar6 < -7) goto LAB_0011a50b;
            if ((int)uVar6 < 8) {
              if (0 < (int)uVar6) {
                secp256k1_ge_from_storage
                          ((secp256k1_ge *)r,
                           (secp256k1_ge_storage *)
                           ((long)&psVar12->x + (ulong)(uVar6 - 1 >> 1) * 0x40));
                return;
              }
              psStack_108 = (secp256k1_fe *)0x11a498;
              secp256k1_ge_from_storage
                        ((secp256k1_ge *)r,
                         (secp256k1_ge_storage *)((long)&psVar12->x + (ulong)(~uVar6 >> 1) * 0x40));
              psStack_108 = (secp256k1_fe *)0x11a4a4;
              secp256k1_fe_verify(&r->y);
              psStack_108 = (secp256k1_fe *)0x11a4b1;
              secp256k1_fe_verify_magnitude((secp256k1_fe *)(ulong)(uint)(r->y).magnitude,1);
              uVar10 = (r->y).n[1];
              uVar2 = (r->y).n[2];
              uVar3 = (r->y).n[3];
              (r->y).n[0] = 0x3ffffbfffff0bc - (r->y).n[0];
              (r->y).n[1] = 0x3ffffffffffffc - uVar10;
              (r->y).n[2] = 0x3ffffffffffffc - uVar2;
              (r->y).n[3] = 0x3ffffffffffffc - uVar3;
              (r->y).n[4] = 0x3fffffffffffc - (r->y).n[4];
              (r->y).magnitude = 2;
              (r->y).normalized = 0;
              secp256k1_fe_verify(&r->y);
              return;
            }
          }
          psStack_108 = (secp256k1_fe *)secp256k1_gej_add_zinv_var;
          secp256k1_ecmult_table_get_ge_storage_cold_1();
          psStack_3a0 = (secp256k1_gej *)0x11a53a;
          auStack_168._56_8_ = psVar8;
          auStack_168._64_8_ = a_05;
          auStack_168._72_8_ = psVar15;
          auStack_168._80_8_ = &local_c8;
          auStack_168._88_8_ = b;
          psStack_108 = psVar9;
          secp256k1_gej_verify(psVar12);
          psStack_3a0 = (secp256k1_gej *)0x11a542;
          secp256k1_ge_verify(a_01);
          psStack_3a0 = (secp256k1_gej *)0x11a54a;
          secp256k1_fe_verify(a_00);
          if (psVar12->infinity != 0) {
            r->infinity = a_01->infinity;
            psStack_3a0 = (secp256k1_gej *)0x11a576;
            secp256k1_fe_sqr(&sStack_228,a_00);
            psStack_3a0 = (secp256k1_gej *)0x11a58c;
            secp256k1_fe_mul(&sStack_198,&sStack_228,a_00);
            psStack_3a0 = (secp256k1_gej *)0x11a59a;
            secp256k1_fe_mul(&r->x,&a_01->x,&sStack_228);
            psStack_3a0 = (secp256k1_gej *)0x11a5ad;
            secp256k1_fe_mul(&r->y,&a_01->y,&sStack_198);
            psVar12 = (secp256k1_gej *)&r->z;
            (r->z).n[0] = 1;
            (r->z).n[1] = 0;
            (r->z).n[2] = 0;
            (r->z).n[3] = 0;
            (r->z).n[4] = 0;
            (r->z).magnitude = 1;
            (r->z).normalized = 1;
LAB_0011a5d8:
            psStack_3a0 = (secp256k1_gej *)0x11a5dd;
            secp256k1_fe_verify(&psVar12->x);
            psStack_3a0 = (secp256k1_gej *)0x11a5e5;
            secp256k1_gej_verify(r);
            return;
          }
          if (a_01->infinity != 0) {
            memcpy(r,psVar12,0x98);
            return;
          }
          psStack_358 = &psVar12->z;
          psStack_3a0 = (secp256k1_gej *)0x11a63c;
          secp256k1_fe_mul(&sStack_228,psStack_358,a_00);
          psStack_3a0 = (secp256k1_gej *)0x11a64f;
          secp256k1_fe_sqr(&sStack_198,&sStack_228);
          sStack_1f8.n[0] = (psVar12->x).n[0];
          sStack_1f8.n[1] = (psVar12->x).n[1];
          sStack_1f8.n[2] = (psVar12->x).n[2];
          sStack_1f8.n[3] = (psVar12->x).n[3];
          sStack_1f8.n[4] = (psVar12->x).n[4];
          sStack_1f8.magnitude = (psVar12->x).magnitude;
          sStack_1f8.normalized = (psVar12->x).normalized;
          psStack_3a0 = (secp256k1_gej *)0x11a684;
          secp256k1_fe_mul((secp256k1_fe *)auStack_2e8,&a_01->x,&sStack_198);
          auStack_348._0_8_ = (psVar12->y).n[0];
          auStack_348._8_8_ = (psVar12->y).n[1];
          auStack_348._16_8_ = (psVar12->y).n[2];
          auStack_348._24_8_ = (psVar12->y).n[3];
          auStack_348._32_8_ = (psVar12->y).n[4];
          auStack_348._40_4_ = (psVar12->y).magnitude;
          auStack_348._44_4_ = (psVar12->y).normalized;
          psStack_3a0 = (secp256k1_gej *)0x11a6c5;
          psStack_390 = psVar12;
          secp256k1_fe_mul(&sStack_1c8,&a_01->y,&sStack_198);
          psStack_3a0 = (secp256k1_gej *)0x11a6d8;
          secp256k1_fe_mul(&sStack_1c8,&sStack_1c8,&sStack_228);
          psStack_3a0 = (secp256k1_gej *)0x11a6e0;
          secp256k1_fe_verify(&sStack_1f8);
          a_03 = (secp256k1_gej *)0x4;
          psStack_3a0 = (secp256k1_gej *)0x11a6ed;
          secp256k1_fe_verify_magnitude((secp256k1_fe *)(sStack_1f8._40_8_ & 0xffffffff),4);
          psVar12 = (secp256k1_gej *)(0x9ffff5ffffd9d6 - sStack_1f8.n[0]);
          psVar16 = (secp256k1_gej *)(0x9ffffffffffff6 - sStack_1f8.n[1]);
          uVar10 = 0x9ffffffffffff6 - sStack_1f8.n[2];
          r_00 = (secp256k1_gej *)(0x9ffffffffffff6 - sStack_1f8.n[3]);
          uStack_398 = 0x9fffffffffff6 - sStack_1f8.n[4];
          uStack_230 = 5;
          psStack_3a0 = (secp256k1_gej *)0x11a75a;
          auStack_288._48_8_ = psVar12;
          psStack_250 = psVar16;
          uStack_248 = uVar10;
          psStack_240 = r_00;
          uStack_238 = uStack_398;
          secp256k1_fe_verify((secp256k1_fe *)(auStack_288 + 0x30));
          psStack_3a0 = (secp256k1_gej *)0x11a762;
          secp256k1_fe_verify((secp256k1_fe *)(auStack_288 + 0x30));
          a_06 = (secp256k1_gej *)auStack_2e8;
          psStack_3a0 = (secp256k1_gej *)0x11a772;
          a_04 = a_06;
          secp256k1_fe_verify((secp256k1_fe *)a_06);
          if ((int)auStack_2e8._40_4_ < 0x1c) {
            psStack_350 = (secp256k1_gej *)((long)(psVar12->x).n + auStack_2e8._0_8_);
            psStack_360 = (secp256k1_gej *)((long)(psVar16->x).n + auStack_2e8._8_8_);
            uStack_370 = uVar10 + auStack_2e8._16_8_;
            psStack_368 = (secp256k1_gej *)((long)(r_00->x).n + auStack_2e8._24_8_);
            uStack_398 = uStack_398 + auStack_2e8._32_8_;
            uStack_230 = (ulong)(auStack_2e8._40_4_ + 5);
            psStack_3a0 = (secp256k1_gej *)0x11a7f0;
            auStack_288._48_8_ = psStack_350;
            psStack_250 = psStack_360;
            uStack_248 = uStack_370;
            psStack_240 = psStack_368;
            uStack_238 = uStack_398;
            secp256k1_fe_verify((secp256k1_fe *)(auStack_288 + 0x30));
            psStack_3a0 = (secp256k1_gej *)0x11a800;
            secp256k1_fe_verify(&sStack_1c8);
            a_03 = (secp256k1_gej *)0x1;
            psStack_3a0 = (secp256k1_gej *)0x11a80e;
            secp256k1_fe_verify_magnitude((secp256k1_fe *)(ulong)(uint)sStack_1c8.magnitude,1);
            r_00 = (secp256k1_gej *)(0x3ffffbfffff0bc - sStack_1c8.n[0]);
            psVar16 = (secp256k1_gej *)(0x3ffffffffffffc - sStack_1c8.n[2]);
            a_06 = (secp256k1_gej *)(0x3ffffffffffffc - sStack_1c8.n[3]);
            psVar12 = (secp256k1_gej *)(0x3fffffffffffc - sStack_1c8.n[4]);
            uStack_290 = 2;
            psStack_3a0 = (secp256k1_gej *)0x11a870;
            auStack_2e8._48_8_ = r_00;
            uStack_2b0 = 0x3ffffffffffffc - sStack_1c8.n[1];
            psStack_2a8 = psVar16;
            psStack_2a0 = a_06;
            psStack_298 = psVar12;
            secp256k1_fe_verify((secp256k1_fe *)(auStack_2e8 + 0x30));
            psStack_3a0 = (secp256k1_gej *)0x11a87d;
            secp256k1_fe_verify((secp256k1_fe *)(auStack_2e8 + 0x30));
            a_04 = (secp256k1_gej *)auStack_348;
            psStack_3a0 = (secp256k1_gej *)0x11a887;
            secp256k1_fe_verify((secp256k1_fe *)a_04);
            if (0x1e < (int)auStack_348._40_4_) goto LAB_0011ad86;
            psStack_380 = (secp256k1_gej *)((long)(r_00->x).n + auStack_348._0_8_);
            uStack_378 = (0x3ffffffffffffc - sStack_1c8.n[1]) + auStack_348._8_8_;
            psStack_388 = (secp256k1_gej *)((long)(psVar16->x).n + auStack_348._16_8_);
            psVar16 = (secp256k1_gej *)((long)(a_06->x).n + auStack_348._24_8_);
            psVar12 = (secp256k1_gej *)((long)(psVar12->x).n + auStack_348._32_8_);
            uStack_290 = (ulong)(auStack_348._40_4_ + 2);
            psStack_3a0 = (secp256k1_gej *)0x11a8f0;
            auStack_2e8._48_8_ = psStack_380;
            uStack_2b0 = uStack_378;
            psStack_2a8 = psStack_388;
            psStack_2a0 = psVar16;
            psStack_298 = psVar12;
            secp256k1_fe_verify((secp256k1_fe *)(auStack_2e8 + 0x30));
            psStack_3a0 = (secp256k1_gej *)0x11a8fd;
            secp256k1_fe_verify((secp256k1_fe *)(auStack_288 + 0x30));
            uVar5 = (uStack_398 >> 0x30) * 0x1000003d1 + (long)psStack_350;
            if (((uVar5 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar5 & 0xfffffffffffff) == 0))
            {
              uVar14 = (long)(psStack_360->x).n + (uVar5 >> 0x34);
              uVar7 = (uVar14 >> 0x34) + uStack_370;
              uVar11 = (long)(psStack_368->x).n + (uVar7 >> 0x34);
              uVar13 = (uVar11 >> 0x34) + (uStack_398 & 0xffffffffffff);
              if ((((uVar14 | uVar5 | uVar7 | uVar11) & 0xfffffffffffff) == 0 && uVar13 == 0) ||
                 (((uVar5 | 0x1000003d0) & uVar14 & uVar7 & uVar11 & (uVar13 ^ 0xf000000000000)) ==
                  0xfffffffffffff)) {
                psStack_3a0 = (secp256k1_gej *)0x11acc2;
                secp256k1_fe_verify((secp256k1_fe *)(auStack_2e8 + 0x30));
                uVar5 = ((ulong)psVar12 >> 0x30) * 0x1000003d1 + (long)psStack_380;
                if (((uVar5 & 0xfffffffffffff) == 0xffffefffffc2f) ||
                   ((uVar5 & 0xfffffffffffff) == 0)) {
                  uVar14 = uStack_378 + (uVar5 >> 0x34);
                  uVar7 = (long)(psStack_388->x).n + (uVar14 >> 0x34);
                  uVar11 = (long)(psVar16->x).n + (uVar7 >> 0x34);
                  uVar13 = (uVar11 >> 0x34) + ((ulong)psVar12 & 0xffffffffffff);
                  if ((((uVar14 | uVar5 | uVar7 | uVar11) & 0xfffffffffffff) == 0 && uVar13 == 0) ||
                     (((uVar5 | 0x1000003d0) & uVar14 & uVar7 & uVar11 & (uVar13 ^ 0xf000000000000))
                      == 0xfffffffffffff)) {
                    psStack_3a0 = (secp256k1_gej *)0x11ad7c;
                    secp256k1_gej_double_var(r,psStack_390,(secp256k1_fe *)0x0);
                    return;
                  }
                }
                psStack_3a0 = (secp256k1_gej *)0x11ad68;
                secp256k1_gej_set_infinity(r);
                return;
              }
            }
            r->infinity = 0;
            a_06 = (secp256k1_gej *)(auStack_288 + 0x30);
            psStack_3a0 = (secp256k1_gej *)0x11a9e4;
            secp256k1_fe_mul(&r->z,psStack_358,(secp256k1_fe *)a_06);
            psVar12 = (secp256k1_gej *)auStack_168;
            psStack_3a0 = (secp256k1_gej *)0x11a9f7;
            secp256k1_fe_sqr((secp256k1_fe *)psVar12,(secp256k1_fe *)a_06);
            psStack_3a0 = (secp256k1_gej *)0x11a9ff;
            secp256k1_fe_verify((secp256k1_fe *)psVar12);
            psStack_3a0 = (secp256k1_gej *)0x11aa0d;
            secp256k1_fe_verify_magnitude((secp256k1_fe *)(auStack_168._40_8_ & 0xffffffff),1);
            auStack_168._0_8_ = 0x3ffffbfffff0bc - auStack_168._0_8_;
            auStack_168._8_8_ = 0x3ffffffffffffc - auStack_168._8_8_;
            auStack_168._16_8_ = 0x3ffffffffffffc - auStack_168._16_8_;
            auStack_168._24_8_ = 0x3ffffffffffffc - auStack_168._24_8_;
            auStack_168._32_8_ = 0x3fffffffffffc - auStack_168._32_8_;
            auStack_168._40_8_ = 2;
            psStack_3a0 = (secp256k1_gej *)0x11aa55;
            secp256k1_fe_verify((secp256k1_fe *)psVar12);
            r_00 = (secp256k1_gej *)(auStack_348 + 0x30);
            psStack_3a0 = (secp256k1_gej *)0x11aa6b;
            secp256k1_fe_mul((secp256k1_fe *)r_00,(secp256k1_fe *)psVar12,(secp256k1_fe *)a_06);
            psStack_3a0 = (secp256k1_gej *)0x11aa83;
            secp256k1_fe_mul((secp256k1_fe *)auStack_288,&sStack_1f8,(secp256k1_fe *)psVar12);
            a_03 = (secp256k1_gej *)(auStack_2e8 + 0x30);
            psStack_3a0 = (secp256k1_gej *)0x11aa93;
            secp256k1_fe_sqr(&r->x,(secp256k1_fe *)a_03);
            psStack_3a0 = (secp256k1_gej *)0x11aa9b;
            secp256k1_fe_verify(&r->x);
            psStack_3a0 = (secp256k1_gej *)0x11aaa3;
            a_04 = r_00;
            secp256k1_fe_verify((secp256k1_fe *)r_00);
            iVar4 = iStack_2f0 + (r->x).magnitude;
            if (0x20 < iVar4) goto LAB_0011ad8b;
            uVar10 = (r->x).n[1];
            uVar2 = (r->x).n[2];
            uVar3 = (r->x).n[3];
            (r->x).n[0] = (r->x).n[0] + auStack_348._48_8_;
            (r->x).n[1] = uVar10 + uStack_310;
            (r->x).n[2] = uVar2 + uStack_308;
            (r->x).n[3] = uVar3 + uStack_300;
            puVar1 = (r->x).n + 4;
            *puVar1 = *puVar1 + uStack_2f8;
            (r->x).magnitude = iVar4;
            (r->x).normalized = 0;
            psStack_3a0 = (secp256k1_gej *)0x11aaf6;
            secp256k1_fe_verify(&r->x);
            psStack_3a0 = (secp256k1_gej *)0x11aafe;
            secp256k1_fe_verify(&r->x);
            psVar12 = (secp256k1_gej *)auStack_288;
            psStack_3a0 = (secp256k1_gej *)0x11ab0e;
            a_04 = psVar12;
            secp256k1_fe_verify((secp256k1_fe *)psVar12);
            iVar4 = auStack_288._40_4_ + (r->x).magnitude;
            if (0x20 < iVar4) goto LAB_0011ad90;
            uVar10 = (r->x).n[1];
            uVar2 = (r->x).n[2];
            uVar3 = (r->x).n[3];
            psVar12 = (secp256k1_gej *)auStack_288;
            (r->x).n[0] = (r->x).n[0] + auStack_288._0_8_;
            (r->x).n[1] = uVar10 + auStack_288._8_8_;
            (r->x).n[2] = uVar2 + auStack_288._16_8_;
            (r->x).n[3] = uVar3 + auStack_288._24_8_;
            puVar1 = (r->x).n + 4;
            *puVar1 = *puVar1 + auStack_288._32_8_;
            (r->x).magnitude = iVar4;
            (r->x).normalized = 0;
            psStack_3a0 = (secp256k1_gej *)0x11ab5d;
            secp256k1_fe_verify(&r->x);
            psStack_3a0 = (secp256k1_gej *)0x11ab65;
            secp256k1_fe_verify(&r->x);
            psStack_3a0 = (secp256k1_gej *)0x11ab6d;
            a_04 = psVar12;
            secp256k1_fe_verify((secp256k1_fe *)psVar12);
            iVar4 = auStack_288._40_4_ + (r->x).magnitude;
            if (0x20 < iVar4) goto LAB_0011ad95;
            uVar10 = (r->x).n[1];
            uVar2 = (r->x).n[2];
            uVar3 = (r->x).n[3];
            psVar12 = (secp256k1_gej *)auStack_288;
            (r->x).n[0] = (r->x).n[0] + auStack_288._0_8_;
            (r->x).n[1] = uVar10 + auStack_288._8_8_;
            (r->x).n[2] = uVar2 + auStack_288._16_8_;
            (r->x).n[3] = uVar3 + auStack_288._24_8_;
            puVar1 = (r->x).n + 4;
            *puVar1 = *puVar1 + auStack_288._32_8_;
            (r->x).magnitude = iVar4;
            (r->x).normalized = 0;
            psStack_3a0 = (secp256k1_gej *)0x11abbc;
            secp256k1_fe_verify(&r->x);
            psStack_3a0 = (secp256k1_gej *)0x11abc4;
            secp256k1_fe_verify((secp256k1_fe *)psVar12);
            psStack_3a0 = (secp256k1_gej *)0x11abcc;
            a_04 = r;
            secp256k1_fe_verify(&r->x);
            iVar4 = (r->x).magnitude + auStack_288._40_4_;
            if (iVar4 < 0x21) {
              auStack_288._0_8_ = (r->x).n[0] + auStack_288._0_8_;
              auStack_288._8_8_ = (r->x).n[1] + auStack_288._8_8_;
              auStack_288._16_8_ = (r->x).n[2] + auStack_288._16_8_;
              auStack_288._24_8_ = (r->x).n[3] + auStack_288._24_8_;
              auStack_288._32_8_ = auStack_288._32_8_ + (r->x).n[4];
              auStack_288._44_4_ = 0;
              psStack_3a0 = (secp256k1_gej *)0x11ac1f;
              auStack_288._40_4_ = iVar4;
              secp256k1_fe_verify((secp256k1_fe *)auStack_288);
              psVar12 = (secp256k1_gej *)&r->y;
              psStack_3a0 = (secp256k1_gej *)0x11ac36;
              secp256k1_fe_mul((secp256k1_fe *)psVar12,(secp256k1_fe *)auStack_288,
                               (secp256k1_fe *)(auStack_2e8 + 0x30));
              a_06 = (secp256k1_gej *)(auStack_348 + 0x30);
              psStack_3a0 = (secp256k1_gej *)0x11ac4e;
              a_03 = a_06;
              secp256k1_fe_mul((secp256k1_fe *)a_06,(secp256k1_fe *)a_06,(secp256k1_fe *)auStack_348
                              );
              psStack_3a0 = (secp256k1_gej *)0x11ac56;
              secp256k1_fe_verify((secp256k1_fe *)psVar12);
              psStack_3a0 = (secp256k1_gej *)0x11ac5e;
              a_04 = a_06;
              secp256k1_fe_verify((secp256k1_fe *)a_06);
              iStack_2f0 = iStack_2f0 + (r->y).magnitude;
              if (iStack_2f0 < 0x21) {
                uVar10 = (r->y).n[1];
                uVar2 = (r->y).n[2];
                uVar3 = (r->y).n[3];
                (r->y).n[0] = (r->y).n[0] + auStack_348._48_8_;
                (r->y).n[1] = uVar10 + uStack_310;
                (r->y).n[2] = uVar2 + uStack_308;
                (r->y).n[3] = uVar3 + uStack_300;
                puVar1 = (r->y).n + 4;
                *puVar1 = *puVar1 + uStack_2f8;
                (r->y).magnitude = iStack_2f0;
                (r->y).normalized = 0;
                goto LAB_0011a5d8;
              }
              goto LAB_0011ad9f;
            }
          }
          else {
            psStack_3a0 = (secp256k1_gej *)0x11ad86;
            secp256k1_gej_add_zinv_var_cold_7();
LAB_0011ad86:
            psStack_3a0 = (secp256k1_gej *)0x11ad8b;
            secp256k1_gej_add_zinv_var_cold_6();
LAB_0011ad8b:
            psStack_3a0 = (secp256k1_gej *)0x11ad90;
            secp256k1_gej_add_zinv_var_cold_5();
LAB_0011ad90:
            psStack_3a0 = (secp256k1_gej *)0x11ad95;
            secp256k1_gej_add_zinv_var_cold_4();
LAB_0011ad95:
            psStack_3a0 = (secp256k1_gej *)0x11ad9a;
            secp256k1_gej_add_zinv_var_cold_3();
          }
          psStack_3a0 = (secp256k1_gej *)0x11ad9f;
          secp256k1_gej_add_zinv_var_cold_2();
LAB_0011ad9f:
          psStack_3a0 = (secp256k1_gej *)secp256k1_ge_set_gej_zinv;
          secp256k1_gej_add_zinv_var_cold_1();
          psStack_3c0 = r;
          psStack_3b8 = r_00;
          psStack_3b0 = psVar16;
          psStack_3a8 = psVar12;
          psStack_3a0 = a_06;
          secp256k1_gej_verify(a_03);
          psVar8 = a_02;
          secp256k1_fe_verify(&a_02->x);
          if (a_03->infinity == 0) {
            secp256k1_fe_sqr(&sStack_3f0,&a_02->x);
            secp256k1_fe_mul(&sStack_420,&sStack_3f0,&a_02->x);
            secp256k1_fe_mul(&a_04->x,&a_03->x,&sStack_3f0);
            secp256k1_fe_mul(&a_04->y,&a_03->y,&sStack_420);
            *(int *)(a_04->z).n = a_03->infinity;
            secp256k1_ge_verify((secp256k1_ge *)a_04);
            return;
          }
          secp256k1_ge_set_gej_zinv_cold_1();
          psVar8->infinity = 1;
          (psVar8->x).n[0] = 0;
          (psVar8->x).n[1] = 0;
          (psVar8->x).n[2] = 0;
          (psVar8->x).n[3] = 0;
          *(undefined8 *)((long)(psVar8->x).n + 0x1c) = 0;
          *(undefined8 *)((long)(psVar8->x).n + 0x24) = 0;
          (psVar8->x).normalized = 1;
          secp256k1_fe_verify(&psVar8->x);
          *(undefined8 *)((long)(psVar8->y).n + 0x1c) = 0;
          *(undefined8 *)((long)(psVar8->y).n + 0x24) = 0;
          (psVar8->y).n[2] = 0;
          (psVar8->y).n[3] = 0;
          (psVar8->y).n[0] = 0;
          (psVar8->y).n[1] = 0;
          (psVar8->y).normalized = 1;
          secp256k1_fe_verify(&psVar8->y);
          secp256k1_ge_verify(psVar8);
          return;
        }
        psVar15 = (secp256k1_fe *)(local_c8.z.n + 1);
        psStack_f0 = (secp256k1_gej *)0x11a3bf;
        secp256k1_fe_sqr(psVar15,&local_c8.x);
        psVar8 = (secp256k1_ge *)(local_c8.y.n + 1);
        psStack_f0 = (secp256k1_gej *)0x11a3d2;
        secp256k1_fe_mul((secp256k1_fe *)psVar8,psVar15,&local_c8.x);
        psStack_f0 = (secp256k1_gej *)0x11a3e0;
        secp256k1_fe_mul(&a_05->x,&a_05->x,psVar15);
        psVar12 = (secp256k1_gej *)&a_05->y;
        psStack_f0 = (secp256k1_gej *)0x11a3f0;
        secp256k1_fe_mul((secp256k1_fe *)psVar12,(secp256k1_fe *)psVar12,(secp256k1_fe *)psVar8);
        psStack_f0 = (secp256k1_gej *)0x11a3f8;
        secp256k1_ge_verify(a_05);
        psVar9 = (secp256k1_fe *)((long)psVar9->n + 1);
        a_05 = a_05 + -1;
      } while (local_d0 != psVar9);
      psVar8 = local_e0;
      sVar17 = local_d8;
      if (local_d8 == 0) {
        return;
      }
    }
    do {
      psStack_f0 = (secp256k1_gej *)0x11a425;
      secp256k1_ge_verify(psVar8);
      psVar8 = psVar8 + 1;
      sVar17 = sVar17 - 1;
    } while (sVar17 != 0);
  }
  return;
}

Assistant:

static void secp256k1_ge_table_set_globalz(size_t len, secp256k1_ge *a, const secp256k1_fe *zr) {
    size_t i;
    secp256k1_fe zs;
#ifdef VERIFY
    for (i = 0; i < len; i++) {
        SECP256K1_GE_VERIFY(&a[i]);
        SECP256K1_FE_VERIFY(&zr[i]);
    }
#endif

    if (len > 0) {
        i = len - 1;
        /* Ensure all y values are in weak normal form for fast negation of points */
        secp256k1_fe_normalize_weak(&a[i].y);
        zs = zr[i];

        /* Work our way backwards, using the z-ratios to scale the x/y values. */
        while (i > 0) {
            if (i != len - 1) {
                secp256k1_fe_mul(&zs, &zs, &zr[i]);
            }
            i--;
            secp256k1_ge_set_ge_zinv(&a[i], &a[i], &zs);
        }
    }

#ifdef VERIFY
    for (i = 0; i < len; i++) {
        SECP256K1_GE_VERIFY(&a[i]);
    }
#endif
}